

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_init(char *argv0)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  ErrState *pEVar5;
  char **ppcVar6;
  PHYSFS_ErrorCode PVar7;
  
  if (initialized == '\x01') {
    PHYSFS_setErrorCode(PHYSFS_ERR_IS_INITIALIZED);
    return 0;
  }
  if (externalAllocator == 0) {
    __PHYSFS_AllocatorHooks.Init = (_func_int *)0x0;
    __PHYSFS_AllocatorHooks.Deinit = (_func_void *)0x0;
    __PHYSFS_AllocatorHooks.Malloc = mallocAllocatorMalloc;
    __PHYSFS_AllocatorHooks.Realloc = mallocAllocatorRealloc;
    __PHYSFS_AllocatorHooks.Free = mallocAllocatorFree;
  }
  else if ((__PHYSFS_AllocatorHooks.Init != (_func_int *)0x0) &&
          (iVar1 = (*__PHYSFS_AllocatorHooks.Init)(), iVar1 == 0)) {
    return 0;
  }
  iVar1 = __PHYSFS_platformInit();
  if (iVar1 == 0) {
    if (__PHYSFS_AllocatorHooks.Deinit != (_func_void *)0x0) {
      (*__PHYSFS_AllocatorHooks.Deinit)();
      return 0;
    }
    return 0;
  }
  errorLock = __PHYSFS_platformCreateMutex();
  if (errorLock == (void *)0x0) {
LAB_00106c6e:
    if (stateLock != (void *)0x0) {
      __PHYSFS_platformDestroyMutex(stateLock);
    }
LAB_00106c7f:
    stateLock = (void *)0x0;
    ppcVar6 = (char **)&errorLock;
  }
  else {
    stateLock = __PHYSFS_platformCreateMutex();
    if (stateLock == (void *)0x0) {
      if (errorLock != (void *)0x0) {
        __PHYSFS_platformDestroyMutex(errorLock);
        goto LAB_00106c6e;
      }
      goto LAB_00106c7f;
    }
    pcVar2 = __PHYSFS_platformCalcBaseDir(argv0);
    if (pcVar2 != (char *)0x0) {
LAB_00106b11:
      baseDir = pcVar2;
      pcVar3 = __PHYSFS_platformCalcUserDir();
      pcVar2 = baseDir;
      userDir = pcVar3;
      if (pcVar3 != (char *)0x0) {
        sVar4 = strlen(baseDir);
        if (pcVar2[sVar4 - 1] != '/') {
          __assert_fail("baseDir[strlen(baseDir) - 1] == __PHYSFS_platformDirSeparator",
                        "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                        ,0x4d5,"int PHYSFS_init(const char *)");
        }
        sVar4 = strlen(pcVar3);
        if (pcVar3[sVar4 - 1] != '/') {
          __assert_fail("userDir[strlen(userDir) - 1] == __PHYSFS_platformDirSeparator",
                        "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                        ,0x4d6,"int PHYSFS_init(const char *)");
        }
        iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_ZIP);
        if (iVar1 != 0) {
          SZIP_global_init();
          iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_7Z);
          if ((((((iVar1 != 0) && (iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_GRP), iVar1 != 0))
                && (iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_QPAK), iVar1 != 0)) &&
               ((iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_HOG), iVar1 != 0 &&
                (iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_MVL), iVar1 != 0)))) &&
              ((iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_WAD), iVar1 != 0 &&
               ((iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_SLB), iVar1 != 0 &&
                (iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_ISO9660), iVar1 != 0)))))) &&
             (iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_VDF), iVar1 != 0)) {
            initialized = '\x01';
            pEVar5 = findErrorForCurrentThread();
            if (pEVar5 == (ErrState *)0x0) {
              PVar7 = PHYSFS_ERR_OK;
            }
            else {
              PVar7 = pEVar5->code;
              pEVar5->code = PHYSFS_ERR_OK;
            }
            PHYSFS_setErrorCode(PVar7);
            return 1;
          }
        }
      }
      goto LAB_00106c98;
    }
    if (argv0 == (char *)0x0) {
      PVar7 = PHYSFS_ERR_ARGV0_IS_NULL;
    }
    else {
      pcVar3 = strrchr(argv0,0x2f);
      if (pcVar3 == (char *)0x0) {
        PVar7 = PHYSFS_ERR_INVALID_ARGUMENT;
      }
      else {
        pcVar2 = (char *)(*__PHYSFS_AllocatorHooks.Malloc)
                                   ((PHYSFS_uint64)(pcVar3 + (2 - (long)argv0)));
        if (pcVar2 != (char *)0x0) {
          memcpy(pcVar2,argv0,(size_t)(pcVar3 + (1 - (long)argv0)));
          pcVar2[(long)(pcVar3 + (1 - (long)argv0))] = '\0';
          goto LAB_00106b11;
        }
        PVar7 = PHYSFS_ERR_OUT_OF_MEMORY;
      }
    }
    PHYSFS_setErrorCode(PVar7);
    ppcVar6 = &baseDir;
  }
  *ppcVar6 = (char *)0x0;
LAB_00106c98:
  doDeinit();
  return 0;
}

Assistant:

int PHYSFS_init(const char *argv0)
{
    BAIL_IF(initialized, PHYSFS_ERR_IS_INITIALIZED, 0);

    if (!externalAllocator)
        setDefaultAllocator();

    if ((allocator.Init != NULL) && (!allocator.Init())) return 0;

    if (!__PHYSFS_platformInit())
    {
        if (allocator.Deinit != NULL) allocator.Deinit();
        return 0;
    } /* if */

    /* everything below here can be cleaned up safely by doDeinit(). */

    if (!initializeMutexes()) goto initFailed;

    baseDir = calculateBaseDir(argv0);
    if (!baseDir) goto initFailed;

    userDir = __PHYSFS_platformCalcUserDir();
    if (!userDir) goto initFailed;

    /* Platform layer is required to append a dirsep. */
    assert(baseDir[strlen(baseDir) - 1] == __PHYSFS_platformDirSeparator);
    assert(userDir[strlen(userDir) - 1] == __PHYSFS_platformDirSeparator);

    if (!initStaticArchivers()) goto initFailed;

    initialized = 1;

    /* This makes sure that the error subsystem is initialized. */
    PHYSFS_setErrorCode(PHYSFS_getLastErrorCode());

    return 1;

initFailed:
    doDeinit();
    return 0;
}